

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::DiskSourceTree::MapPath
          (DiskSourceTree *this,string_view virtual_path,string_view disk_path)

{
  DiskSourceTree *pDVar1;
  string_view path;
  string local_c8;
  allocator<char> local_91;
  string local_90;
  Mapping local_70;
  DiskSourceTree *local_30;
  DiskSourceTree *this_local;
  string_view disk_path_local;
  string_view virtual_path_local;
  
  disk_path_local._M_len = (size_t)disk_path._M_str;
  pDVar1 = (DiskSourceTree *)disk_path._M_len;
  disk_path_local._M_str = (char *)virtual_path._M_len;
  local_30 = this;
  this_local = pDVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_90,
             (basic_string_view<char,_std::char_traits<char>_> *)&disk_path_local._M_str,&local_91);
  path._M_str = (char *)pDVar1;
  path._M_len = disk_path_local._M_len;
  CanonicalizePath_abi_cxx11_(&local_c8,(compiler *)this_local,path);
  Mapping::Mapping(&local_70,&local_90,&local_c8);
  std::
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ::push_back(&this->mappings_,&local_70);
  Mapping::~Mapping(&local_70);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  return;
}

Assistant:

void DiskSourceTree::MapPath(absl::string_view virtual_path,
                             absl::string_view disk_path) {
  mappings_.push_back(
      Mapping(std::string(virtual_path), CanonicalizePath(disk_path)));
}